

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImVector<ImGuiSettingsHandler> *this;
  char *__dest;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var1;
  ImGuiContext *pIVar2;
  ImGuiSettingsHandler *pIVar3;
  char *pcVar4;
  char *pcVar5;
  void *pvVar6;
  int handler_n;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  
  pIVar2 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x28d3,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  ImVector<char>::resize(&(pIVar2->SettingsIniData).Buf,(int)ini_size + 1);
  __dest = (pIVar2->SettingsIniData).Buf.Data;
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  this = &pIVar2->SettingsHandlers;
  for (iVar7 = 0; iVar7 < this->Size; iVar7 = iVar7 + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
    if (pIVar3->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
      p_Var1 = pIVar3->ReadInitFn;
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
      (*p_Var1)(pIVar2,pIVar3);
    }
  }
  pIVar3 = (ImGuiSettingsHandler *)0x0;
  pvVar6 = (void *)0x0;
  pcVar9 = __dest;
  while (pcVar9 < __dest + ini_size) {
    for (; (*pcVar9 == '\n' || (pcVar8 = pcVar9, *pcVar9 == '\r')); pcVar9 = pcVar9 + 1) {
    }
    for (; ((pcVar8 < __dest + ini_size && (*pcVar8 != '\n')) && (*pcVar8 != '\r'));
        pcVar8 = pcVar8 + 1) {
    }
    *pcVar8 = '\0';
    if (*pcVar9 != ';') {
      if (((*pcVar9 == '[') && (pcVar9 < pcVar8)) && (pcVar8[-1] == ']')) {
        pcVar5 = pcVar8 + -1;
        *pcVar5 = '\0';
        pcVar4 = ImStrchrRange(pcVar9 + 1,pcVar5,']');
        if ((pcVar4 != (char *)0x0) &&
           (pcVar5 = ImStrchrRange(pcVar4 + 1,pcVar5,'['), pcVar5 != (char *)0x0)) {
          *pcVar4 = '\0';
          pIVar3 = FindSettingsHandler(pcVar9 + 1);
          if (pIVar3 == (ImGuiSettingsHandler *)0x0) {
            pIVar3 = (ImGuiSettingsHandler *)0x0;
            pvVar6 = (void *)0x0;
          }
          else {
            pvVar6 = (*pIVar3->ReadOpenFn)(pIVar2,pIVar3,pcVar5 + 1);
          }
        }
      }
      else if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (pvVar6 != (void *)0x0)) {
        (*pIVar3->ReadLineFn)(pIVar2,pIVar3,pvVar6,pcVar9);
      }
    }
    pcVar9 = pcVar8 + 1;
  }
  pIVar2->SettingsLoaded = true;
  memcpy(__dest,ini_data,ini_size);
  for (iVar7 = 0; iVar7 < this->Size; iVar7 = iVar7 + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
    if (pIVar3->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
      p_Var1 = pIVar3->ApplyAllFn;
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,iVar7);
      (*p_Var1)(pIVar2,pIVar3);
    }
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ReadInitFn)
            g.SettingsHandlers[handler_n].ReadInitFn(&g, &g.SettingsHandlers[handler_n]);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ApplyAllFn)
            g.SettingsHandlers[handler_n].ApplyAllFn(&g, &g.SettingsHandlers[handler_n]);
}